

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

void __thiscall
dg::vr::RelationsAnalyzer::solveDifferent
          (RelationsAnalyzer *this,ValueRelations *graph,BinaryOperator *op)

{
  BinaryOperator BVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Type TVar4;
  Type TVar5;
  V pVVar6;
  ulong uVar7;
  int64_t iVar8;
  Relations RVar9;
  APInt *pAVar10;
  pair<llvm::Value_*,_llvm::ConstantInt_*> pVar11;
  long lStack_80;
  BinaryOperator *op_local;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> boundC;
  V local_60;
  long local_58;
  ConstantInt *newBound;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> sample;
  
  BVar1 = op[0x10];
  op_local = op;
  pVar11 = getParams(op);
  pVVar6 = pVar11.first;
  if (pVVar6 == (V)0x0) {
    return;
  }
  local_60 = pVVar6;
  if (BVar1 == (BinaryOperator)0x2a) {
    pAVar10 = (APInt *)(pVar11.second + 0x18);
    bVar3 = llvm::APInt::isAllOnes(pAVar10);
    if (bVar3) goto LAB_0013324c;
    bVar3 = llvm::APInt::isOne(pAVar10);
  }
  else {
    if (BVar1 != (BinaryOperator)0x28) {
      return;
    }
    pAVar10 = (APInt *)(pVar11.second + 0x18);
    bVar3 = llvm::APInt::isOne(pAVar10);
    if (bVar3) {
LAB_0013324c:
      TVar5 = SLT;
      lStack_80 = 1;
      goto LAB_00133268;
    }
    bVar3 = llvm::APInt::isAllOnes(pAVar10);
  }
  if (bVar3 == false) {
    return;
  }
  TVar5 = SGT;
  lStack_80 = -1;
LAB_00133268:
  bVar3 = canShift(this,graph,pVVar6,TVar5);
  if (bVar3) {
    local_58 = lStack_80;
    ValueRelations::set<llvm::Value_const*,llvm::BinaryOperator_const*>
              (graph,&local_60,TVar5,&op_local);
    pVVar6 = local_60;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = boundC.second.bits.super__Base_bitset<1UL>._M_w;
    boundC = (pair<const_llvm::ConstantInt_*,_dg::vr::Relations>)(auVar2 << 0x40);
    std::bitset<12UL>::set((bitset<12UL> *)&boundC,(ulong)TVar5,true);
    ValueRelations::getDirectlyRelated(&sample,graph,pVVar6,(Relations *)&boundC);
    for (; sample.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           sample.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
        sample.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
        .super__Vector_impl_data._M_start =
             sample.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
             _M_impl.super__Vector_impl_data._M_start + 1) {
      boundC.first = (ConstantInt *)
                     *sample.
                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      TVar4 = dg::vr::Relations::getNonStrict(TVar5);
      ValueRelations::set<llvm::BinaryOperator_const*,llvm::Value_const*>
                (graph,&op_local,TVar4,(Value **)&boundC);
    }
    TVar4 = dg::vr::Relations::getNonStrict(TVar5);
    boundC = ValueRelations::getBound<llvm::Value_const*>(graph,&local_60,TVar4);
    RVar9 = boundC.second.bits.super__Base_bitset<1UL>._M_w;
    if ((boundC.first != (ConstantInt *)0x0) &&
       (uVar7 = dg::vr::Relations::getNonStrict(TVar5),
       ((ulong)RVar9.bits.super__Base_bitset<1UL>._M_w >> (uVar7 & 0x3f) & 1) != 0)) {
      TVar4 = dg::vr::Relations::getNonStrict(TVar5);
      bVar3 = ValueRelations::are<llvm::BinaryOperator_const*,llvm::ConstantInt_const*>
                        (graph,&op_local,TVar4,&boundC.first);
      if (!bVar3) {
        iVar8 = llvm::APInt::getSExtValue((APInt *)(boundC.first + 0x18));
        newBound = (ConstantInt *)
                   llvm::ConstantInt::get(*(IntegerType **)boundC.first,local_58 + iVar8,true);
        TVar5 = dg::vr::Relations::getNonStrict(TVar5);
        ValueRelations::set<llvm::BinaryOperator_const*,llvm::ConstantInt_const*>
                  (graph,&op_local,TVar5,&newBound);
      }
    }
    std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
              (&sample.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
              );
  }
  return;
}

Assistant:

void RelationsAnalyzer::solveDifferent(ValueRelations &graph,
                                       const llvm::BinaryOperator *op) {
    auto opcode = op->getOpcode();

    V param = nullptr;
    llvm::ConstantInt *c = nullptr;
    std::tie(param, c) = getParams(op);

    if (!param)
        return;

    assert(param && c);

    Relations::Type shift;
    if ((opcode == llvm::Instruction::Add && c->isOne()) ||
        (opcode == llvm::Instruction::Sub && c->isMinusOne())) {
        shift = Relations::SLT;
    } else if ((opcode == llvm::Instruction::Add && c->isMinusOne()) ||
               (opcode == llvm::Instruction::Sub && c->isOne())) {
        shift = Relations::SGT;
    } else
        return;

    if (canShift(graph, param, shift)) {
        graph.set(param, shift, op);

        std::vector<V> sample =
                graph.getDirectlyRelated(param, Relations().set(shift));

        for (V val : sample) {
            assert(graph.are(param, shift, val));
            graph.set(op, Relations::getNonStrict(shift), val);
        }

        auto boundC = graph.getBound(param, Relations::getNonStrict(shift));
        if (boundC.first && boundC.second.has(Relations::getNonStrict(shift)) &&
            !graph.are(op, Relations::getNonStrict(shift), boundC.first)) {
            int64_t intC = boundC.first->getSExtValue();
            intC += shift == Relations::SLT ? 1 : -1;
            const auto *newBound =
                    llvm::ConstantInt::get(boundC.first->getType(), intC, true);
            graph.set(op, Relations::getNonStrict(shift), newBound);
        }
    }
}